

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

void __thiscall Assembler::processGlobalSecondPass(Assembler *this,string *line)

{
  iterator iVar1;
  undefined8 *puVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
          ::find(&(this->symbolTable)._M_t,line);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->symbolTable)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
            ::find(&(this->symbolTable)._M_t,line);
    *(undefined1 *)&iVar1._M_node[3]._M_parent = 1;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00130a28;
  __cxa_throw(puVar2,&NotDefGlobalSecondPassError::typeinfo,std::exception::~exception);
}

Assistant:

void Assembler::processGlobalSecondPass(string line) {
    if (symbolTable.find(line) == symbolTable.end()) throw NotDefGlobalSecondPassError();
    symbolTable.find(line)->second.isGlobal = true;
}